

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-port.h
# Opt level: O0

void __thiscall
testing::internal::
ThreadLocal<std::vector<testing::internal::TraceInfo,_std::allocator<testing::internal::TraceInfo>_>_>
::~ThreadLocal(ThreadLocal<std::vector<testing::internal::TraceInfo,_std::allocator<testing::internal::TraceInfo>_>_>
               *this)

{
  void *value_holder;
  ostream *poVar1;
  GTestLog local_18;
  int local_14;
  ThreadLocal<std::vector<testing::internal::TraceInfo,_std::allocator<testing::internal::TraceInfo>_>_>
  *pTStack_10;
  int gtest_error;
  ThreadLocal<std::vector<testing::internal::TraceInfo,_std::allocator<testing::internal::TraceInfo>_>_>
  *this_local;
  
  pTStack_10 = this;
  value_holder = pthread_getspecific(this->key_);
  DeleteThreadLocalValue(value_holder);
  local_14 = pthread_key_delete(this->key_);
  if (local_14 != 0) {
    GTestLog::GTestLog(&local_18,GTEST_FATAL,
                       "/workspace/llm4binary/github/license_c_cmakelists/loganzartman[P]gl-pic-fluid/googletest/googletest/include/gtest/internal/gtest-port.h"
                       ,0x6dd);
    poVar1 = GTestLog::GetStream(&local_18);
    poVar1 = std::operator<<(poVar1,"pthread_key_delete(key_)");
    poVar1 = std::operator<<(poVar1,"failed with error ");
    std::ostream::operator<<(poVar1,local_14);
    GTestLog::~GTestLog(&local_18);
  }
  std::
  unique_ptr<testing::internal::ThreadLocal<std::vector<testing::internal::TraceInfo,_std::allocator<testing::internal::TraceInfo>_>_>::ValueHolderFactory,_std::default_delete<testing::internal::ThreadLocal<std::vector<testing::internal::TraceInfo,_std::allocator<testing::internal::TraceInfo>_>_>::ValueHolderFactory>_>
  ::~unique_ptr(&this->default_factory_);
  return;
}

Assistant:

~ThreadLocal() {
    // Destroys the managed object for the current thread, if any.
    DeleteThreadLocalValue(pthread_getspecific(key_));

    // Releases resources associated with the key.  This will *not*
    // delete managed objects for other threads.
    GTEST_CHECK_POSIX_SUCCESS_(pthread_key_delete(key_));
  }